

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  uint uVar1;
  int iVar2;
  Parse local_1b8;
  
  uVar1 = sqlite3FindDbName(pDb,zDb);
  if (uVar1 == 1) {
    memset(&local_1b8.zErrMsg,0,400);
    local_1b8.db = pDb;
    iVar2 = sqlite3OpenTempDatabase(&local_1b8);
    if (iVar2 != 0) {
      sqlite3ErrorWithMsg(pErrorDb,local_1b8.rc,"%s",local_1b8.zErrMsg);
      if (local_1b8.zErrMsg != (char *)0x0) {
        sqlite3DbFreeNN(pErrorDb,local_1b8.zErrMsg);
      }
      sqlite3ParserReset(&local_1b8);
      return (Btree *)0x0;
    }
    if (local_1b8.zErrMsg != (char *)0x0) {
      sqlite3DbFreeNN(pErrorDb,local_1b8.zErrMsg);
    }
    sqlite3ParserReset(&local_1b8);
  }
  else if ((int)uVar1 < 0) {
    sqlite3ErrorWithMsg(pErrorDb,1,"unknown database %s",zDb);
    return (Btree *)0x0;
  }
  return pDb->aDb[uVar1].pBt;
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse sParse;
    int rc = 0;
    memset(&sParse, 0, sizeof(sParse));
    sParse.db = pDb;
    if( sqlite3OpenTempDatabase(&sParse) ){
      sqlite3ErrorWithMsg(pErrorDb, sParse.rc, "%s", sParse.zErrMsg);
      rc = SQLITE_ERROR;
    }
    sqlite3DbFree(pErrorDb, sParse.zErrMsg);
    sqlite3ParserReset(&sParse);
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3ErrorWithMsg(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}